

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_ts.cpp
# Opt level: O3

string * __thiscall
flatbuffers::ts::TsGenerator::GenDefaultValue
          (string *__return_storage_ptr__,TsGenerator *this,FieldDef *field,import_set *imports)

{
  IdlNamer *pIVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  BaseType BVar3;
  EnumDef *pEVar4;
  long lVar5;
  undefined8 uVar6;
  bool bVar7;
  int iVar8;
  string *extraout_RAX;
  string *extraout_RAX_00;
  EnumVal *pEVar9;
  long *plVar10;
  string *psVar11;
  undefined8 *puVar12;
  string *extraout_RAX_01;
  size_type *psVar13;
  long *plVar14;
  pointer *ppcVar15;
  char *pcVar16;
  char *pcVar17;
  _Alloc_hider _Var18;
  pointer pcVar19;
  uint uVar20;
  string enum_name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string enum_value;
  string *local_1a8;
  size_type local_1a0;
  string local_198;
  pointer local_178;
  long lStack_170;
  TsGenerator *local_168;
  string *local_160;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_158;
  import_set *local_150;
  long *local_148 [2];
  long local_138 [2];
  long *local_128;
  long local_120;
  long local_118;
  long lStack_110;
  ImportDefinition local_108;
  string *local_38;
  
  BVar3 = (field->value).type.base_type;
  local_168 = this;
  local_150 = imports;
  if ((BVar3 - BASE_TYPE_UTYPE < 0xc) && (field->presence == kOptional)) {
switchD_0024b96d_caseD_10:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar17 = "null";
    pcVar16 = "";
    goto LAB_0024b92e;
  }
  pEVar4 = (field->value).type.enum_def;
  if (pEVar4 == (EnumDef *)0x0) {
    switch(BVar3) {
    case BASE_TYPE_BOOL:
      iVar8 = std::__cxx11::string::compare((char *)&(field->value).constant);
      pcVar17 = "true";
      if (iVar8 == 0) {
        pcVar17 = "false";
      }
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar16 = pcVar17 + (ulong)(iVar8 == 0) + 4;
      break;
    default:
      psVar11 = &(field->value).constant;
      iVar8 = std::__cxx11::string::compare((char *)psVar11);
      if (((iVar8 == 0) || (iVar8 = std::__cxx11::string::compare((char *)psVar11), iVar8 == 0)) ||
         (iVar8 = std::__cxx11::string::compare((char *)psVar11), iVar8 == 0)) {
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        pcVar17 = "NaN";
        pcVar16 = "";
      }
      else {
        bVar7 = StringIsFlatbufferPositiveInfinity(psVar11);
        if (bVar7) {
          (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
          pcVar17 = "Infinity";
          pcVar16 = "";
        }
        else {
          bVar7 = StringIsFlatbufferNegativeInfinity(psVar11);
          (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
          if (!bVar7) {
            pcVar19 = (field->value).constant._M_dataplus._M_p;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)__return_storage_ptr__,pcVar19,
                       pcVar19 + (field->value).constant._M_string_length);
            return extraout_RAX_01;
          }
          pcVar17 = "-Infinity";
          pcVar16 = "";
        }
      }
      break;
    case BASE_TYPE_LONG:
    case BASE_TYPE_ULONG:
      std::operator+(&local_108.name,"BigInt(\'",&(field->value).constant);
      plVar10 = (long *)std::__cxx11::string::append((char *)&local_108);
      goto LAB_0024b9ed;
    case BASE_TYPE_STRING:
    case BASE_TYPE_STRUCT:
    case BASE_TYPE_UNION:
      goto switchD_0024b96d_caseD_10;
    case BASE_TYPE_VECTOR:
    case BASE_TYPE_ARRAY:
      goto switchD_0024b96d_caseD_e;
    }
LAB_0024b92e:
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)__return_storage_ptr__,pcVar17,pcVar16);
    return extraout_RAX;
  }
  switch(BVar3) {
  case BASE_TYPE_LONG:
  case BASE_TYPE_ULONG:
    std::operator+(&local_108.name,"BigInt(\'",&(field->value).constant);
    plVar10 = (long *)std::__cxx11::string::append((char *)&local_108);
LAB_0024b9ed:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    psVar13 = (size_type *)(plVar10 + 2);
    if ((size_type *)*plVar10 == psVar13) {
      lVar5 = plVar10[3];
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar13;
      *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar5;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar10;
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar13;
    }
    __return_storage_ptr__->_M_string_length = plVar10[1];
    *plVar10 = (long)psVar13;
    plVar10[1] = 0;
    *(undefined1 *)(plVar10 + 2) = 0;
    goto LAB_0024ba46;
  case BASE_TYPE_VECTOR:
switchD_0024b96d_caseD_e:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar17 = "[]";
    pcVar16 = "";
    goto LAB_0024b92e;
  case BASE_TYPE_UNION:
    goto switchD_0024b96d_caseD_10;
  case BASE_TYPE_ARRAY:
    local_158 = &__return_storage_ptr__->field_2;
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_158;
    local_160 = __return_storage_ptr__;
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"[","");
    if ((field->value).type.fixed_length != 0) {
      paVar2 = &local_108.name.field_2;
      local_38 = &(field->value).constant;
      pIVar1 = &local_168->namer_;
      uVar20 = 0;
      do {
        pEVar4 = (field->value).type.enum_def;
        AddImport<flatbuffers::EnumDef>
                  (&local_108,local_168,local_150,&pEVar4->super_Definition,pEVar4);
        local_1a8 = &local_198;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_108.name._M_dataplus._M_p == paVar2) {
          local_198._M_string_length = local_108.name.field_2._8_8_;
        }
        else {
          local_1a8 = (string *)local_108.name._M_dataplus._M_p;
        }
        local_198._M_dataplus._M_p._1_7_ = local_108.name.field_2._M_allocated_capacity._1_7_;
        local_198._M_dataplus._M_p._0_1_ = local_108.name.field_2._M_local_buf[0];
        local_1a0 = local_108.name._M_string_length;
        local_108.name._M_string_length = 0;
        local_108.name.field_2._M_local_buf[0] = '\0';
        local_108.name._M_dataplus._M_p = (pointer)paVar2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_108.object_name._M_dataplus._M_p != &local_108.object_name.field_2) {
          operator_delete(local_108.object_name._M_dataplus._M_p,
                          local_108.object_name.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_108.rel_file_path._M_dataplus._M_p != &local_108.rel_file_path.field_2) {
          operator_delete(local_108.rel_file_path._M_dataplus._M_p,
                          local_108.rel_file_path.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_108.bare_file_path._M_dataplus._M_p != &local_108.bare_file_path.field_2) {
          operator_delete(local_108.bare_file_path._M_dataplus._M_p,
                          local_108.bare_file_path.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_108.export_statement._M_dataplus._M_p != &local_108.export_statement.field_2) {
          operator_delete(local_108.export_statement._M_dataplus._M_p,
                          local_108.export_statement.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_108.import_statement._M_dataplus._M_p != &local_108.import_statement.field_2) {
          operator_delete(local_108.import_statement._M_dataplus._M_p,
                          local_108.import_statement.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_108.name._M_dataplus._M_p != paVar2) {
          operator_delete(local_108.name._M_dataplus._M_p,
                          CONCAT71(local_108.name.field_2._M_allocated_capacity._1_7_,
                                   local_108.name.field_2._M_local_buf[0]) + 1);
        }
        pEVar9 = EnumDef::FindByValue((field->value).type.enum_def,local_38);
        (*(pIVar1->super_Namer)._vptr_Namer[0x13])(&local_108,pIVar1,pEVar9);
        local_148[0] = local_138;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_148,local_1a8,(long)&(local_1a8->_M_dataplus)._M_p + local_1a0);
        std::__cxx11::string::append((char *)local_148);
        plVar10 = (long *)std::__cxx11::string::_M_append
                                    ((char *)local_148,(ulong)local_108.name._M_dataplus._M_p);
        plVar14 = plVar10 + 2;
        if ((long *)*plVar10 == plVar14) {
          local_118 = *plVar14;
          lStack_110 = plVar10[3];
          local_128 = &local_118;
        }
        else {
          local_118 = *plVar14;
          local_128 = (long *)*plVar10;
        }
        local_120 = plVar10[1];
        *plVar10 = (long)plVar14;
        plVar10[1] = 0;
        *(undefined1 *)(plVar10 + 2) = 0;
        plVar10 = (long *)std::__cxx11::string::append((char *)&local_128);
        local_198.field_2._M_allocated_capacity = (size_type)&local_178;
        ppcVar15 = (pointer *)(plVar10 + 2);
        if ((pointer *)*plVar10 == ppcVar15) {
          local_178 = *ppcVar15;
          lStack_170 = plVar10[3];
        }
        else {
          local_178 = *ppcVar15;
          local_198.field_2._M_allocated_capacity = (size_type)(pointer *)*plVar10;
        }
        local_198.field_2._8_8_ = plVar10[1];
        *plVar10 = (long)ppcVar15;
        plVar10[1] = 0;
        *(undefined1 *)(plVar10 + 2) = 0;
        std::__cxx11::string::_M_append((char *)local_160,local_198.field_2._M_allocated_capacity);
        if ((pointer *)local_198.field_2._M_allocated_capacity != &local_178) {
          operator_delete((void *)local_198.field_2._M_allocated_capacity,(ulong)(local_178 + 1));
        }
        if (local_128 != &local_118) {
          operator_delete(local_128,local_118 + 1);
        }
        if (local_148[0] != local_138) {
          operator_delete(local_148[0],local_138[0] + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_108.name._M_dataplus._M_p != paVar2) {
          operator_delete(local_108.name._M_dataplus._M_p,
                          CONCAT71(local_108.name.field_2._M_allocated_capacity._1_7_,
                                   local_108.name.field_2._M_local_buf[0]) + 1);
        }
        if (local_1a8 != &local_198) {
          operator_delete(local_1a8,(ulong)(local_198._M_dataplus._M_p + 1));
        }
        uVar20 = uVar20 + 1;
      } while (uVar20 < (field->value).type.fixed_length);
    }
    psVar11 = (string *)std::__cxx11::string::append((char *)local_160);
    return psVar11;
  }
  pEVar9 = EnumDef::FindByValue(pEVar4,&(field->value).constant);
  if (pEVar9 == (EnumVal *)0x0) {
    pEVar9 = EnumDef::MinValue((field->value).type.enum_def);
  }
  pEVar4 = (field->value).type.enum_def;
  AddImport<flatbuffers::EnumDef>(&local_108,local_168,local_150,&pEVar4->super_Definition,pEVar4);
  plVar10 = (long *)std::__cxx11::string::append((char *)&local_108);
  psVar11 = (string *)(plVar10 + 2);
  if ((string *)*plVar10 == psVar11) {
    local_198._M_dataplus._M_p = (psVar11->_M_dataplus)._M_p;
    local_198._M_string_length = plVar10[3];
    local_1a8 = &local_198;
  }
  else {
    local_198._M_dataplus._M_p = (psVar11->_M_dataplus)._M_p;
    local_1a8 = (string *)*plVar10;
  }
  local_1a0 = plVar10[1];
  *plVar10 = (long)psVar11;
  plVar10[1] = 0;
  *(undefined1 *)(plVar10 + 2) = 0;
  (*(local_168->namer_).super_Namer._vptr_Namer[0x13])(&local_198.field_2,&local_168->namer_,pEVar9)
  ;
  _Var18._M_p = (pointer)0xf;
  if (local_1a8 != &local_198) {
    _Var18._M_p = local_198._M_dataplus._M_p;
  }
  if (_Var18._M_p < (pointer)(local_198.field_2._8_8_ + local_1a0)) {
    pcVar19 = (pointer)0xf;
    if ((pointer *)local_198.field_2._M_allocated_capacity != &local_178) {
      pcVar19 = local_178;
    }
    if (pcVar19 < (pointer)(local_198.field_2._8_8_ + local_1a0)) goto LAB_0024c008;
    puVar12 = (undefined8 *)
              std::__cxx11::string::replace
                        ((ulong)&local_198.field_2,0,(char *)0x0,(ulong)local_1a8);
  }
  else {
LAB_0024c008:
    puVar12 = (undefined8 *)
              std::__cxx11::string::_M_append
                        ((char *)&local_1a8,local_198.field_2._M_allocated_capacity);
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  psVar13 = puVar12 + 2;
  if ((size_type *)*puVar12 == psVar13) {
    uVar6 = puVar12[3];
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar13;
    *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uVar6;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*puVar12;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar13;
  }
  __return_storage_ptr__->_M_string_length = puVar12[1];
  *puVar12 = psVar13;
  puVar12[1] = 0;
  *(undefined1 *)psVar13 = 0;
  if ((pointer *)local_198.field_2._M_allocated_capacity != &local_178) {
    operator_delete((void *)local_198.field_2._M_allocated_capacity,(ulong)(local_178 + 1));
  }
  if (local_1a8 != &local_198) {
    operator_delete(local_1a8,(ulong)(local_198._M_dataplus._M_p + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_108.object_name._M_dataplus._M_p != &local_108.object_name.field_2) {
    operator_delete(local_108.object_name._M_dataplus._M_p,
                    local_108.object_name.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_108.rel_file_path._M_dataplus._M_p != &local_108.rel_file_path.field_2) {
    operator_delete(local_108.rel_file_path._M_dataplus._M_p,
                    local_108.rel_file_path.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_108.bare_file_path._M_dataplus._M_p != &local_108.bare_file_path.field_2) {
    operator_delete(local_108.bare_file_path._M_dataplus._M_p,
                    local_108.bare_file_path.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_108.export_statement._M_dataplus._M_p != &local_108.export_statement.field_2) {
    operator_delete(local_108.export_statement._M_dataplus._M_p,
                    local_108.export_statement.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_108.import_statement._M_dataplus._M_p != &local_108.import_statement.field_2) {
    operator_delete(local_108.import_statement._M_dataplus._M_p,
                    local_108.import_statement.field_2._M_allocated_capacity + 1);
  }
LAB_0024ba46:
  psVar11 = (string *)&local_108.name.field_2;
  if ((string *)local_108.name._M_dataplus._M_p != psVar11) {
    operator_delete(local_108.name._M_dataplus._M_p,
                    CONCAT71(local_108.name.field_2._M_allocated_capacity._1_7_,
                             local_108.name.field_2._M_local_buf[0]) + 1);
    psVar11 = extraout_RAX_00;
  }
  return psVar11;
}

Assistant:

std::string GenDefaultValue(const FieldDef &field, import_set &imports) {
    if (field.IsScalarOptional()) { return "null"; }

    const auto &value = field.value;
    if (value.type.enum_def && value.type.base_type != BASE_TYPE_UNION &&
        value.type.base_type != BASE_TYPE_VECTOR) {
      switch (value.type.base_type) {
        case BASE_TYPE_ARRAY: {
          std::string ret = "[";
          for (auto i = 0; i < value.type.fixed_length; ++i) {
            std::string enum_name =
                AddImport(imports, *value.type.enum_def, *value.type.enum_def)
                    .name;
            std::string enum_value = namer_.Variant(
                *value.type.enum_def->FindByValue(value.constant));
            ret += enum_name + "." + enum_value +
                   (i < value.type.fixed_length - 1 ? ", " : "");
          }
          ret += "]";
          return ret;
        }
        case BASE_TYPE_LONG:
        case BASE_TYPE_ULONG: {
          // If the value is an enum with a 64-bit base type, we have to just
          // return the bigint value directly since typescript does not support
          // enums with bigint backing types.
          return "BigInt('" + value.constant + "')";
        }
        default: {
          EnumVal *val = value.type.enum_def->FindByValue(value.constant);
          if (val == nullptr)
            val = const_cast<EnumVal *>(value.type.enum_def->MinValue());
          return AddImport(imports, *value.type.enum_def, *value.type.enum_def)
                     .name +
                 "." + namer_.Variant(*val);
        }
      }
    }

    switch (value.type.base_type) {
      case BASE_TYPE_BOOL: return value.constant == "0" ? "false" : "true";

      case BASE_TYPE_STRING:
      case BASE_TYPE_UNION:
      case BASE_TYPE_STRUCT: {
        return "null";
      }

      case BASE_TYPE_ARRAY:
      case BASE_TYPE_VECTOR: return "[]";

      case BASE_TYPE_LONG:
      case BASE_TYPE_ULONG: {
        return "BigInt('" + value.constant + "')";
      }

      default: {
        if (StringIsFlatbufferNan(value.constant)) {
          return "NaN";
        } else if (StringIsFlatbufferPositiveInfinity(value.constant)) {
          return "Infinity";
        } else if (StringIsFlatbufferNegativeInfinity(value.constant)) {
          return "-Infinity";
        }
        return value.constant;
      }
    }
  }